

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>>
               (Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>
               *rhs,Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *dest,Scalar *alpha)

{
  non_const_type pMVar1;
  long cols;
  long rows;
  ResScalar *res;
  long resIncr;
  undefined8 *puVar2;
  const_blas_data_mapper<float,_long,_1> *pcVar3;
  float *__ptr;
  Scalar alpha_00;
  const_blas_data_mapper<float,_long,_1> local_88;
  long local_78;
  long lStack_70;
  undefined8 local_68;
  long lStack_60;
  const_blas_data_mapper<float,_long,_0> local_50;
  float *local_40;
  type actualRhs;
  
  pcVar3 = &local_88;
  pMVar1 = lhs->m_matrix;
  local_88.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data =
       (float *)(rhs->m_matrix).
                super_BlockImpl<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_false>
                .m_xpr.m_lhs.m_matrix;
  local_88.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride =
       (long)(rhs->m_matrix).
             super_BlockImpl<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_false>
             .m_xpr.m_rhs.m_diagonal;
  local_78 = (rhs->m_matrix).
             super_BlockImpl<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_false>
             .m_startRow.m_value;
  lStack_70 = (rhs->m_matrix).
              super_BlockImpl<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_false>
              .m_startCol.m_value;
  local_68 = *(undefined8 *)
              &(rhs->m_matrix).
               super_BlockImpl<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_false>
               .field_0x20;
  lStack_60 = (rhs->m_matrix).
              super_BlockImpl<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true,_false>
              .m_blockCols.m_value;
  PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_40,
             (DenseBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>_>
              *)&local_88);
  if ((ulong)actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
             m_data >> 0x3e != 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = boost::program_options::detail::cmdline::cmdline;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  alpha_00 = *alpha;
  if (local_40 == (float *)0x0) {
    if (actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data <
        (float *)0x8001) {
      local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
           (float *)((long)&local_88 -
                    ((long)actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data * 4 + 0x1eU & 0xfffffffffffffff0));
      pcVar3 = (const_blas_data_mapper<float,_long,_1> *)
               local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
      __ptr = local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
    }
    else {
      actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
           = alpha_00;
      local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
           (float *)malloc((long)actualRhs.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data * 4);
      if (((ulong)local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      __ptr = local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
      alpha_00 = actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows._4_4_;
      if (local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data == (float *)0x0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = boost::program_options::detail::cmdline::cmdline;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = local_40;
    pcVar3 = &local_88;
    __ptr = (float *)0x0;
  }
  cols = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  rows = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_88.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data =
       (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_88.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride =
       (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
  res = (dest->m_matrix).
        super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data
  ;
  if ((res != (ResScalar *)0x0) &&
     ((dest->m_matrix).
      super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value < 0)) {
    *(float *)((long)pcVar3 + -8) = 2.200764e-39;
    *(float *)((long)pcVar3 + -4) = 0.0;
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float, -1, -1>, 1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float, -1, -1>, 1>>, -1, 1, true>, Level = 0]"
                 );
  }
  resIncr = (((dest->m_matrix).
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
             m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
  *(float *)((long)pcVar3 + -8) = 2.200602e-39;
  *(float *)((long)pcVar3 + -4) = 0.0;
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
  ::run(rows,cols,&local_88,&local_50,res,resIncr,alpha_00);
  if ((float *)0x8000 <
      actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    *(float *)((long)pcVar3 + -8) = 2.200626e-39;
    *(float *)((long)pcVar3 + -4) = 0.0;
    free(__ptr);
  }
  *(float *)((long)pcVar3 + -8) = 2.200638e-39;
  *(float *)((long)pcVar3 + -4) = 0.0;
  free(local_40);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }